

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw.c
# Opt level: O2

parasail_result_t *
parasail_sw(char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  parasail_result_t *ppVar9;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  int iVar15;
  ulong size;
  char *__format;
  uint uVar16;
  int iVar17;
  long lVar18;
  int *local_70;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar14 = "_s2";
  }
  else if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar14 = "s2Len";
  }
  else if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar14 = "open";
  }
  else if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar14 = "gap";
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar14 = "matrix";
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
LAB_004eed25:
      ppVar9 = parasail_result_new();
      if (ppVar9 != (parasail_result_t *)0x0) {
        ppVar9->flag = ppVar9->flag | 0x1400104;
        ptr = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
        size = (ulong)(s2Len + 1);
        ptr_00 = parasail_memalign_int(0x10,size);
        ptr_01 = parasail_memalign_int(0x10,size);
        if (ptr_01 != (int *)0x0 && (ptr_00 != (int *)0x0 && ptr != (int *)0x0)) {
          if (matrix->type == 0) {
            local_70 = parasail_memalign_int(0x10,(long)_s1Len);
            uVar12 = 0;
            if (local_70 == (int *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar13 = 0;
            if (0 < _s1Len) {
              uVar13 = (ulong)(uint)_s1Len;
            }
            for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
              local_70[uVar12] = matrix->mapper[(byte)_s1[uVar12]];
            }
          }
          else {
            local_70 = (int *)0x0;
          }
          piVar4 = matrix->mapper;
          for (uVar12 = 0; (uint)s2Len != uVar12; uVar12 = uVar12 + 1) {
            ptr[uVar12] = piVar4[(byte)_s2[uVar12]];
          }
          *ptr_00 = 0;
          *ptr_01 = -0x40000000;
          for (uVar12 = 1; size != uVar12; uVar12 = uVar12 + 1) {
            ptr_00[uVar12] = 0;
            ptr_01[uVar12] = -0x40000000;
          }
          uVar8 = 0;
          if (0 < _s1Len) {
            uVar8 = _s1Len;
          }
          iVar15 = -0x40000000;
          for (uVar12 = 1; uVar12 != uVar8 + 1; uVar12 = uVar12 + 1) {
            iVar2 = matrix->size;
            lVar6 = uVar12 - 1;
            if (matrix->type == 0) {
              lVar6 = (long)local_70[uVar12 - 1];
            }
            piVar4 = matrix->matrix;
            iVar10 = *ptr_00;
            *ptr_00 = 0;
            iVar17 = -0x40000000;
            iVar11 = 0;
            lVar18 = 0;
            while (size - 1 != lVar18) {
              iVar3 = ptr_00[lVar18 + 1];
              iVar5 = ptr_01[lVar18 + 1] - gap;
              if (ptr_01[lVar18 + 1] - gap < iVar3 - open) {
                iVar5 = iVar3 - open;
              }
              iVar17 = iVar17 - gap;
              if (iVar17 < iVar11 - open) {
                iVar17 = iVar11 - open;
              }
              ptr_01[lVar18 + 1] = iVar5;
              iVar11 = iVar10 + piVar4[iVar2 * lVar6 + (long)ptr[lVar18]];
              if (iVar11 <= iVar17) {
                iVar11 = iVar17;
              }
              if (iVar11 <= iVar5) {
                iVar11 = iVar5;
              }
              lVar1 = lVar18 + 1;
              if (iVar11 < 1) {
                iVar11 = 0;
              }
              ptr_00[lVar18 + 1] = iVar11;
              uVar16 = (uint)(uVar12 - 1);
              iVar10 = (int)lVar18;
              uVar7 = uVar16;
              if ((iVar11 <= iVar15) &&
                 (iVar10 = s2Len, uVar7 = _s1Len, lVar1 <= s2Len && iVar11 == iVar15)) {
                iVar10 = (int)lVar18;
                uVar7 = uVar16;
              }
              _s1Len = uVar7;
              s2Len = iVar10;
              lVar18 = lVar1;
              iVar10 = iVar3;
              if (iVar15 <= iVar11) {
                iVar15 = iVar11;
              }
            }
          }
          ppVar9->score = iVar15;
          ppVar9->end_query = _s1Len;
          ppVar9->end_ref = s2Len;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(local_70);
            return ppVar9;
          }
          return ppVar9;
        }
      }
      return (parasail_result_t *)0x0;
    }
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar14 = "_s1";
    }
    else {
      if (0 < _s1Len) goto LAB_004eed25;
      __format = "%s: %s must be > 0\n";
      pcVar14 = "_s1Len";
    }
  }
  fprintf(_stderr,__format,"parasail_sw",pcVar14);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict F = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    i = 0;
    j = 0;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!F) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    F[0] = NEG_INF_32;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = 0;
        F[j] = NEG_INF_32;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int WH = 0;
        int E = NEG_INF_32;
        H[0] = WH;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            NH = H[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E    - gap;
            E    = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, 0);
            WH = MAX(WH, E);
            WH = MAX(WH, F[j]);
            H[j] = WH;
            if (WH > score) {
                end_query = i-1;
                end_ref = j-1;
            }
            else if (score == WH && j-1 < end_ref) {
                end_query = i-1;
                end_ref = j-1;
            }
            score = MAX(score,WH);
#ifdef PARASAIL_TABLE
            result->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
#endif
        }
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_col[i-1] = WH;
#endif
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->rowcols->score_row[j-1] = H[j];
    }
#endif

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(F);
    parasail_free(H);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}